

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderIntegerFunctionTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::ImulExtendedCase::getInputValues
          (ImulExtendedCase *this,int numValues,void **values)

{
  long lVar1;
  long lVar2;
  deUint32 dVar3;
  DataType dataType;
  int iVar4;
  deUint32 dVar5;
  int iVar6;
  int iVar7;
  char *str;
  const_reference pvVar8;
  int adj1;
  int adj0;
  deInt32 base1;
  deInt32 base0;
  int compNdx_1;
  int compNdx;
  int easyCaseNdx;
  anon_struct_8_2_947311e6 easyCases [7];
  int valueNdx;
  deUint32 *in1;
  deUint32 *in0;
  int scalarSize;
  DataType type;
  Random rnd;
  void **values_local;
  int numValues_local;
  ImulExtendedCase *this_local;
  
  rnd.m_rnd._8_8_ = values;
  str = tcu::TestNode::getName((TestNode *)this);
  dVar3 = deStringHash(str);
  de::Random::Random((Random *)&scalarSize,dVar3 ^ 0x224fa1);
  pvVar8 = std::
           vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ::operator[](&(this->super_IntegerFunctionCase).m_spec.inputs,0);
  dataType = glu::VarType::getBasicType(&pvVar8->varType);
  iVar4 = glu::getDataTypeScalarSize(dataType);
  lVar1 = *(long *)rnd.m_rnd._8_8_;
  lVar2 = *(long *)(rnd.m_rnd._8_8_ + 8);
  easyCases[6].y = 0;
  memcpy(&compNdx,&DAT_02c0e7f0,0x38);
  for (compNdx_1 = 0; compNdx_1 < 7; compNdx_1 = compNdx_1 + 1) {
    for (base0 = 0; base0 < iVar4; base0 = base0 + 1) {
      *(int *)(lVar1 + (long)(int)(easyCases[6].y * iVar4 + base0) * 4) =
           (&compNdx)[(long)compNdx_1 * 2];
      *(deUint32 *)(lVar2 + (long)(int)(easyCases[6].y * iVar4 + base0) * 4) =
           easyCases[(long)compNdx_1 + -1].y;
    }
    easyCases[6].y = easyCases[6].y + 1;
  }
  for (; (int)easyCases[6].y < numValues; easyCases[6].y = easyCases[6].y + 1) {
    for (base1 = 0; base1 < iVar4; base1 = base1 + 1) {
      dVar3 = de::Random::getUint32((Random *)&scalarSize);
      dVar5 = de::Random::getUint32((Random *)&scalarSize);
      iVar6 = de::Random::getInt((Random *)&scalarSize,0,0x14);
      iVar7 = de::Random::getInt((Random *)&scalarSize,0,0x14);
      *(int *)(lVar1 + (long)(int)(easyCases[6].y * iVar4 + base1) * 4) =
           (int)dVar3 >> ((byte)iVar6 & 0x1f);
      *(int *)(lVar2 + (long)(int)(easyCases[6].y * iVar4 + base1) * 4) =
           (int)dVar5 >> ((byte)iVar7 & 0x1f);
    }
  }
  de::Random::~Random((Random *)&scalarSize);
  return;
}

Assistant:

void getInputValues (int numValues, void* const* values) const
	{
		de::Random				rnd			(deStringHash(getName()) ^ 0x224fa1u);
		const glu::DataType		type		= m_spec.inputs[0].varType.getBasicType();
//		const glu::Precision	precision	= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize	= glu::getDataTypeScalarSize(type);
		deUint32*				in0			= (deUint32*)values[0];
		deUint32*				in1			= (deUint32*)values[1];
		int						valueNdx	= 0;

		const struct
		{
			deUint32	x;
			deUint32	y;
		} easyCases[] =
		{
			{ 0x00000000u,	0x00000000u },
			{ 0xffffffffu,	0x00000002u },
			{ 0x7fffffffu,	0x00000001u },
			{ 0x7fffffffu,	0x00000002u },
			{ 0x7fffffffu,	0x7fffffffu },
			{ 0xffffffffu,	0xffffffffu },
			{ 0x7fffffffu,	0xfffffffeu },
		};

		for (int easyCaseNdx = 0; easyCaseNdx < DE_LENGTH_OF_ARRAY(easyCases); easyCaseNdx++)
		{
			for (int compNdx = 0; compNdx < scalarSize; compNdx++)
			{
				in0[valueNdx*scalarSize + compNdx] = (deInt32)easyCases[easyCaseNdx].x;
				in1[valueNdx*scalarSize + compNdx] = (deInt32)easyCases[easyCaseNdx].y;
			}

			valueNdx += 1;
		}

		while (valueNdx < numValues)
		{
			for (int compNdx = 0; compNdx < scalarSize; compNdx++)
			{
				const deInt32	base0	= (deInt32)rnd.getUint32();
				const deInt32	base1	= (deInt32)rnd.getUint32();
				const int		adj0	= rnd.getInt(0, 20);
				const int		adj1	= rnd.getInt(0, 20);
				in0[valueNdx*scalarSize + compNdx] = base0 >> adj0;
				in1[valueNdx*scalarSize + compNdx] = base1 >> adj1;
			}

			valueNdx += 1;
		}
	}